

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

__pid_t __thiscall kj::UnixEventPort::wait(UnixEventPort *this,void *__stat_loc)

{
  bool bVar1;
  Duration unit;
  undefined7 extraout_var;
  int timeout;
  char local_28;
  int local_20;
  
  unit.value = std::chrono::_V2::steady_clock::now();
  TimerImpl::timeoutToNextEvent((TimerImpl *)&local_28,(TimePoint)&this->timerImpl,unit,1000000);
  timeout = -1;
  if (local_28 != '\0') {
    timeout = local_20;
  }
  bVar1 = doEpollWait(this,timeout);
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool UnixEventPort::wait() {
  return doEpollWait(
      timerImpl.timeoutToNextEvent(readClock(), MILLISECONDS, int(maxValue))
          .map([](uint64_t t) -> int { return t; })
          .orDefault(-1));
}